

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsMessageQueue::TadsMessageQueue(TadsMessageQueue *this,OS_Event *quit_evt)

{
  void *pvVar1;
  void *pvVar2;
  long in_RSI;
  OS_Mutex *in_RDI;
  OS_Event *in_stack_ffffffffffffffe0;
  
  CVmRefCntObj::CVmRefCntObj((CVmRefCntObj *)0x251b6d);
  (in_RDI->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessageQueue_0042b6e0;
  pvVar1 = operator_new(0x38);
  OS_Mutex::OS_Mutex(in_RDI);
  (in_RDI->h).__align = (long)pvVar1;
  pvVar2 = operator_new(0x88);
  OS_Event::OS_Event(in_stack_ffffffffffffffe0,(int)((ulong)pvVar1 >> 0x20));
  *(void **)((long)&in_RDI->h + 8) = pvVar2;
  (in_RDI->h).__data.__list.__next = (__pthread_internal_list *)0x0;
  (in_RDI->h).__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(long *)((long)&in_RDI->h + 0x10) = in_RSI;
  if (in_RSI != 0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x251bfa);
  }
  return;
}

Assistant:

TadsMessageQueue(OS_Event *quit_evt)
    {
        /* create our mutex object */
        mu = new OS_Mutex();

        /* create our event - this signals when a message arrives */
        ev = new OS_Event(FALSE);

        /* no messages in the queue yet */
        head = tail = 0;

        /* remember my global quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }